

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O1

void a0idalloc(void *ptr,_Bool is_internal)

{
  rtree_ctx_cache_elm_t *prVar1;
  void *pvVar2;
  rtree_leaf_elm_t *prVar3;
  ulong uVar4;
  ulong uVar5;
  rtree_leaf_elm_t *prVar6;
  long *plVar7;
  ulong uVar8;
  undefined7 in_register_00000031;
  rtree_ctx_cache_elm_t *prVar9;
  rtree_ctx_cache_elm_t *prVar10;
  rtree_leaf_elm_t *prVar11;
  uint uVar12;
  bool bVar13;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_ctx_t local_1a0;
  
  if ((int)CONCAT71(in_register_00000031,is_internal) != 0) {
    duckdb_je_rtree_ctx_data_init(&local_1a0);
    prVar3 = local_1a0.l2_cache[0].leaf;
    uVar12 = (uint)((ulong)ptr >> 0x1e) & 0xf;
    prVar11 = (rtree_leaf_elm_t *)((ulong)ptr & 0xffffffffc0000000);
    uVar5 = (ulong)(uVar12 << 4);
    plVar7 = (long *)((long)&local_1a0.cache[0].leafkey + uVar5);
    prVar6 = (rtree_leaf_elm_t *)*plVar7;
    if (prVar6 == prVar11) {
      prVar6 = (rtree_leaf_elm_t *)
               ((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) +
               *(long *)((long)&local_1a0.cache[0].leaf + uVar5));
    }
    else if ((rtree_leaf_elm_t *)local_1a0.l2_cache[0].leafkey == prVar11) {
      local_1a0.l2_cache[0].leafkey = (uintptr_t)prVar6;
      local_1a0.l2_cache[0].leaf = *(rtree_leaf_elm_t **)((long)&local_1a0.cache[0].leaf + uVar5);
      *plVar7 = (long)prVar11;
      *(rtree_leaf_elm_t **)((long)&local_1a0.cache[0].leaf + uVar5) = prVar3;
      prVar6 = (rtree_leaf_elm_t *)
               ((long)&(prVar3->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
    }
    else {
      prVar9 = local_1a0.l2_cache + 1;
      if ((rtree_leaf_elm_t *)local_1a0.l2_cache[1].leafkey == prVar11) {
        uVar8 = 0;
        bVar13 = false;
      }
      else {
        uVar4 = 1;
        prVar10 = prVar9;
        do {
          uVar8 = uVar4;
          bVar13 = 6 < uVar8;
          if (uVar8 == 7) goto LAB_0116f3b7;
          prVar9 = prVar10 + 1;
          prVar1 = prVar10 + 1;
          uVar4 = uVar8 + 1;
          prVar10 = prVar9;
        } while ((rtree_leaf_elm_t *)prVar1->leafkey != prVar11);
        bVar13 = 6 < uVar8;
      }
      prVar3 = prVar9->leaf;
      prVar9->leafkey = local_1a0.l2_cache[uVar8].leafkey;
      prVar9->leaf = local_1a0.l2_cache[uVar8].leaf;
      local_1a0.l2_cache[uVar8].leafkey = (uintptr_t)prVar6;
      local_1a0.l2_cache[uVar8].leaf =
           *(rtree_leaf_elm_t **)((long)&local_1a0.cache[0].leaf + uVar5);
      *plVar7 = (long)prVar11;
      *(rtree_leaf_elm_t **)((long)&local_1a0.cache[0].leaf + uVar5) = prVar3;
      prVar6 = (rtree_leaf_elm_t *)
               ((long)&(prVar3->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
LAB_0116f3b7:
      if (bVar13) {
        prVar6 = duckdb_je_rtree_leaf_elm_lookup_hard
                           ((tsdn_t *)0x0,&duckdb_je_arena_emap_global.rtree,&local_1a0,
                            (uintptr_t)ptr,true,false);
      }
    }
    pvVar2 = duckdb_je_arenas
             [*(uint *)(((long)(prVar6->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80) & 0xfff
             ].repr;
    duckdb_je_rtree_ctx_data_init(&local_1a0);
    prVar3 = local_1a0.l2_cache[0].leaf;
    uVar5 = (ulong)(uVar12 << 4);
    plVar7 = (long *)((long)&local_1a0.cache[0].leafkey + uVar5);
    prVar6 = (rtree_leaf_elm_t *)*plVar7;
    if (prVar6 == prVar11) {
      prVar6 = (rtree_leaf_elm_t *)
               ((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) +
               *(long *)((long)&local_1a0.cache[0].leaf + uVar5));
    }
    else if ((rtree_leaf_elm_t *)local_1a0.l2_cache[0].leafkey == prVar11) {
      local_1a0.l2_cache[0].leafkey = (uintptr_t)prVar6;
      local_1a0.l2_cache[0].leaf = *(rtree_leaf_elm_t **)((long)&local_1a0.cache[0].leaf + uVar5);
      *plVar7 = (long)prVar11;
      *(rtree_leaf_elm_t **)((long)&local_1a0.cache[0].leaf + uVar5) = prVar3;
      prVar6 = (rtree_leaf_elm_t *)
               ((long)&(prVar3->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
    }
    else {
      prVar9 = local_1a0.l2_cache + 1;
      if ((rtree_leaf_elm_t *)local_1a0.l2_cache[1].leafkey == prVar11) {
        uVar8 = 0;
        bVar13 = false;
      }
      else {
        uVar4 = 1;
        prVar10 = prVar9;
        do {
          uVar8 = uVar4;
          bVar13 = 6 < uVar8;
          if (uVar8 == 7) goto LAB_0116f43a;
          prVar9 = prVar10 + 1;
          prVar1 = prVar10 + 1;
          uVar4 = uVar8 + 1;
          prVar10 = prVar9;
        } while ((rtree_leaf_elm_t *)prVar1->leafkey != prVar11);
        bVar13 = 6 < uVar8;
      }
      prVar3 = prVar9->leaf;
      prVar9->leafkey = local_1a0.l2_cache[uVar8].leafkey;
      prVar9->leaf = local_1a0.l2_cache[uVar8].leaf;
      local_1a0.l2_cache[uVar8].leafkey = (uintptr_t)prVar6;
      local_1a0.l2_cache[uVar8].leaf =
           *(rtree_leaf_elm_t **)((long)&local_1a0.cache[0].leaf + uVar5);
      *plVar7 = (long)prVar11;
      *(rtree_leaf_elm_t **)((long)&local_1a0.cache[0].leaf + uVar5) = prVar3;
      prVar6 = (rtree_leaf_elm_t *)
               ((long)&(prVar3->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
LAB_0116f43a:
      if (bVar13) {
        prVar6 = duckdb_je_rtree_leaf_elm_lookup_hard
                           ((tsdn_t *)0x0,&duckdb_je_arena_emap_global.rtree,&local_1a0,
                            (uintptr_t)ptr,true,false);
      }
    }
    LOCK();
    plVar7 = (long *)((long)pvVar2 + 0x48);
    *plVar7 = *plVar7 - duckdb_je_sz_index2size_tab[(ulong)(prVar6->le_bits).repr >> 0x30];
    UNLOCK();
  }
  arena_dalloc_no_tcache((tsdn_t *)0x0,ptr);
  return;
}

Assistant:

static void
a0idalloc(void *ptr, bool is_internal) {
	idalloctm(TSDN_NULL, ptr, NULL, NULL, is_internal, true);
}